

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RollingBuffer_p.cpp
# Opt level: O0

size_t __thiscall BamTools::Internal::RollingBuffer::BlockSize(RollingBuffer *this)

{
  deque<BamTools::Internal::ByteArray,_std::allocator<BamTools::Internal::ByteArray>_> *in_RDI;
  ByteArray *first;
  size_t local_8;
  
  if ((in_RDI->
      super__Deque_base<BamTools::Internal::ByteArray,_std::allocator<BamTools::Internal::ByteArray>_>
      )._M_impl.super__Deque_impl_data._M_start._M_cur == (_Elt_pointer)0x0) {
    local_8 = (in_RDI->
              super__Deque_base<BamTools::Internal::ByteArray,_std::allocator<BamTools::Internal::ByteArray>_>
              )._M_impl.super__Deque_impl_data._M_map_size -
              (long)(in_RDI->
                    super__Deque_base<BamTools::Internal::ByteArray,_std::allocator<BamTools::Internal::ByteArray>_>
                    )._M_impl.super__Deque_impl_data._M_map;
  }
  else {
    std::deque<BamTools::Internal::ByteArray,_std::allocator<BamTools::Internal::ByteArray>_>::front
              (in_RDI);
    local_8 = ByteArray::Size((ByteArray *)0x1da9ea);
    local_8 = local_8 - (long)(in_RDI->
                              super__Deque_base<BamTools::Internal::ByteArray,_std::allocator<BamTools::Internal::ByteArray>_>
                              )._M_impl.super__Deque_impl_data._M_map;
  }
  return local_8;
}

Assistant:

std::size_t RollingBuffer::BlockSize() const
{

    // if only one byte array in buffer <- needed?
    if (m_tailBufferIndex == 0) {
        return m_tail - m_head;
    }

    // otherwise return remaining num bytes in first array
    const ByteArray& first = m_data.front();
    return first.Size() - m_head;
}